

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O0

uint llvm::findMaximalSubpartOfIllFormedUTF8Sequence(UTF8 *source,UTF8 *sourceEnd)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  Boolean BVar4;
  UTF8 *pUVar5;
  bool local_2a;
  bool local_29;
  bool local_28;
  bool local_27;
  bool local_26;
  bool local_25;
  UTF8 b3;
  UTF8 b2;
  UTF8 b1;
  UTF8 *sourceEnd_local;
  UTF8 *source_local;
  
  BVar4 = isLegalUTF8Sequence(source,sourceEnd);
  if (BVar4 != '\0') {
    __assert_fail("!isLegalUTF8Sequence(source, sourceEnd)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTF.cpp"
                  ,0x1ac,
                  "unsigned int llvm::findMaximalSubpartOfIllFormedUTF8Sequence(const UTF8 *, const UTF8 *)"
                 );
  }
  if (source == sourceEnd) {
    source_local._4_4_ = 0;
  }
  else {
    bVar1 = *source;
    if ((bVar1 < 0xc2) || (0xdf < bVar1)) {
      if (source + 1 == sourceEnd) {
        source_local._4_4_ = 1;
      }
      else {
        bVar2 = source[1];
        pUVar5 = source + 2;
        if (bVar1 == 0xe0) {
          source_local._4_4_ = 1;
          if (0x9f < bVar2 && bVar2 < 0xc0) {
            source_local._4_4_ = 2;
          }
        }
        else if ((bVar1 < 0xe1) || (0xec < bVar1)) {
          if (bVar1 == 0xed) {
            local_26 = (char)bVar2 < -0x60;
            source_local._4_4_ = 1;
            if (local_26) {
              source_local._4_4_ = 2;
            }
          }
          else if ((bVar1 < 0xee) || (0xef < bVar1)) {
            if (bVar1 == 0xf0) {
              if ((bVar2 < 0x90) || (0xbf < bVar2)) {
                source_local._4_4_ = 1;
              }
              else if (pUVar5 == sourceEnd) {
                source_local._4_4_ = 2;
              }
              else {
                local_28 = (char)*pUVar5 < -0x40;
                source_local._4_4_ = 2;
                if (local_28) {
                  source_local._4_4_ = 3;
                }
              }
            }
            else if ((bVar1 < 0xf1) || (0xf3 < bVar1)) {
              if (bVar1 == 0xf4) {
                if ((bVar2 < 0x80) || (0x8f < bVar2)) {
                  source_local._4_4_ = 1;
                }
                else if (pUVar5 == sourceEnd) {
                  source_local._4_4_ = 2;
                }
                else {
                  local_2a = (char)*pUVar5 < -0x40;
                  source_local._4_4_ = 2;
                  if (local_2a) {
                    source_local._4_4_ = 3;
                  }
                }
              }
              else {
                if ((bVar1 < 0x80) || (bVar3 = true, 0xc1 < bVar1)) {
                  bVar3 = 0xf4 < bVar1;
                }
                if (!bVar3) {
                  __assert_fail("(b1 >= 0x80 && b1 <= 0xC1) || b1 >= 0xF5",
                                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTF.cpp"
                                ,0x1fa,
                                "unsigned int llvm::findMaximalSubpartOfIllFormedUTF8Sequence(const UTF8 *, const UTF8 *)"
                               );
                }
                source_local._4_4_ = 1;
              }
            }
            else if ((bVar2 < 0x80) || (0xbf < bVar2)) {
              source_local._4_4_ = 1;
            }
            else if (pUVar5 == sourceEnd) {
              source_local._4_4_ = 2;
            }
            else {
              local_29 = (char)*pUVar5 < -0x40;
              source_local._4_4_ = 2;
              if (local_29) {
                source_local._4_4_ = 3;
              }
            }
          }
          else {
            local_27 = (char)bVar2 < -0x40;
            source_local._4_4_ = 1;
            if (local_27) {
              source_local._4_4_ = 2;
            }
          }
        }
        else {
          local_25 = (char)bVar2 < -0x40;
          source_local._4_4_ = 1;
          if (local_25) {
            source_local._4_4_ = 2;
          }
        }
      }
    }
    else {
      source_local._4_4_ = 1;
    }
  }
  return source_local._4_4_;
}

Assistant:

static unsigned
findMaximalSubpartOfIllFormedUTF8Sequence(const UTF8 *source,
                                          const UTF8 *sourceEnd) {
  UTF8 b1, b2, b3;

  assert(!isLegalUTF8Sequence(source, sourceEnd));

  /*
   * Unicode 6.3.0, D93b:
   *
   *   Maximal subpart of an ill-formed subsequence: The longest code unit
   *   subsequence starting at an unconvertible offset that is either:
   *   a. the initial subsequence of a well-formed code unit sequence, or
   *   b. a subsequence of length one.
   */

  if (source == sourceEnd)
    return 0;

  /*
   * Perform case analysis.  See Unicode 6.3.0, Table 3-7. Well-Formed UTF-8
   * Byte Sequences.
   */

  b1 = *source;
  ++source;
  if (b1 >= 0xC2 && b1 <= 0xDF) {
    /*
     * First byte is valid, but we know that this code unit sequence is
     * invalid, so the maximal subpart has to end after the first byte.
     */
    return 1;
  }

  if (source == sourceEnd)
    return 1;

  b2 = *source;
  ++source;

  if (b1 == 0xE0) {
    return (b2 >= 0xA0 && b2 <= 0xBF) ? 2 : 1;
  }
  if (b1 >= 0xE1 && b1 <= 0xEC) {
    return (b2 >= 0x80 && b2 <= 0xBF) ? 2 : 1;
  }
  if (b1 == 0xED) {
    return (b2 >= 0x80 && b2 <= 0x9F) ? 2 : 1;
  }
  if (b1 >= 0xEE && b1 <= 0xEF) {
    return (b2 >= 0x80 && b2 <= 0xBF) ? 2 : 1;
  }
  if (b1 == 0xF0) {
    if (b2 >= 0x90 && b2 <= 0xBF) {
      if (source == sourceEnd)
        return 2;

      b3 = *source;
      return (b3 >= 0x80 && b3 <= 0xBF) ? 3 : 2;
    }
    return 1;
  }
  if (b1 >= 0xF1 && b1 <= 0xF3) {
    if (b2 >= 0x80 && b2 <= 0xBF) {
      if (source == sourceEnd)
        return 2;

      b3 = *source;
      return (b3 >= 0x80 && b3 <= 0xBF) ? 3 : 2;
    }
    return 1;
  }
  if (b1 == 0xF4) {
    if (b2 >= 0x80 && b2 <= 0x8F) {
      if (source == sourceEnd)
        return 2;

      b3 = *source;
      return (b3 >= 0x80 && b3 <= 0xBF) ? 3 : 2;
    }
    return 1;
  }

  assert((b1 >= 0x80 && b1 <= 0xC1) || b1 >= 0xF5);
  /*
   * There are no valid sequences that start with these bytes.  Maximal subpart
   * is defined to have length 1 in these cases.
   */
  return 1;
}